

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O0

bool __thiscall zsummer::log4z::CSem::Wait(CSem *this,int timeout)

{
  int iVar1;
  time_t tVar2;
  undefined1 local_30 [8];
  timespec ts;
  int timeout_local;
  CSem *this_local;
  
  ts.tv_nsec._4_4_ = timeout;
  if (timeout < 1) {
    iVar1 = sem_wait((sem_t *)&this->m_semid);
  }
  else {
    tVar2 = time((time_t *)0x0);
    local_30 = (undefined1  [8])(tVar2 + ts.tv_nsec._4_4_ / 1000);
    ts.tv_sec = (__time_t)((ts.tv_nsec._4_4_ % 1000) * 1000000);
    iVar1 = sem_timedwait((sem_t *)&this->m_semid,(timespec *)local_30);
  }
  this_local._7_1_ = iVar1 == 0;
  return this_local._7_1_;
}

Assistant:

bool Wait(int timeout = 0)
	{
#ifdef WIN32
		if (timeout <= 0)
		{
			timeout = INFINITE;
		}
		if (WaitForSingleObject(m_hSem, timeout) != WAIT_OBJECT_0)
		{
			return false;
		}
#else
		if (timeout <= 0)
		{
			return (sem_wait(&m_semid) == 0);
		}
		else
		{
			timespec ts;
			ts.tv_sec = time(NULL) + timeout/1000;
			ts.tv_nsec = (timeout%1000)*1000000;
			return (sem_timedwait(&m_semid, &ts) == 0);
		}
#endif
		return true;
	}